

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

void fmt_PrintNumber(char *buf,size_t bufLen,FormatSpec *fmt,uint32_t value)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  char cVar5;
  char *__format;
  int32_t v;
  ulong uVar6;
  size_t sVar7;
  size_t __n_00;
  size_t sVar8;
  char cVar9;
  bool bVar10;
  double dVar11;
  char valueBuf [262];
  undefined8 local_140;
  byte local_138 [264];
  
  uVar2 = fmt->type - 0x58;
  if (((0x20 < uVar2) || ((0x100800401U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
     (fmt->prefix == true)) {
    error("Formatting type \'%c\' with prefix flag \'#\'\n");
  }
  if ((fmt->type != 0x66) && (fmt->hasFrac == true)) {
    error("Formatting type \'%c\' with fractional width\n");
  }
  if (fmt->type == 0x73) {
    error("Formatting number as type \'s\'\n");
  }
  cVar9 = (char)fmt->sign;
  uVar2 = fmt->type;
  if ((uVar2 | 2) == 0x66) {
    if (0x80000000 < value) {
      value = -value;
      cVar9 = '-';
    }
  }
  if (fmt->prefix == true) {
    cVar5 = '$';
    if (uVar2 != 0x58) {
      if (uVar2 == 0x62) {
        cVar5 = '%';
      }
      else if (uVar2 != 0x78) {
        cVar5 = '&';
        if (uVar2 != 0x6f) {
          cVar5 = '\0';
        }
      }
    }
  }
  else {
    cVar5 = '\0';
  }
  if ((int)uVar2 < 0x66) {
    if (uVar2 == 0x58) {
      __format = "%X";
    }
    else {
      if (uVar2 == 0x62) {
        uVar4 = (ulong)value;
        uVar6 = 0xffffffffffffffff;
        do {
          uVar3 = uVar6;
          local_138[uVar3 + 1] = (byte)value & 1 | 0x30;
          uVar4 = uVar4 >> 1;
          uVar6 = uVar3 + 1;
          bVar10 = 1 < value;
          value = (uint)uVar4;
        } while (bVar10);
        local_138[uVar3 + 2] = 0;
        if (uVar6 != 0) {
          uVar4 = 1;
          do {
            bVar1 = local_138[uVar4 - 1];
            local_138[uVar4 - 1] = local_138[uVar6];
            local_138[uVar6] = bVar1;
            uVar6 = uVar6 - 1;
            bVar10 = uVar4 < uVar6;
            uVar4 = uVar4 + 1;
          } while (bVar10);
        }
        goto LAB_0010b656;
      }
      if (uVar2 == 100) {
        __format = "%d";
      }
      else {
LAB_0010b5d2:
        __format = "%d";
        if (uVar2 == 0x6f) {
          __format = "%o";
        }
      }
    }
  }
  else {
    if (uVar2 == 0x66) {
      sVar7 = 5;
      if (fmt->hasFrac == true) {
        sVar7 = fmt->fracWidth;
      }
      if (0xff < sVar7) {
        error("Fractional width %zu too long, limiting to 255\n",sVar7);
        sVar7 = 0xff;
      }
      local_140 = (double)value;
      dVar11 = fix_PrecisionFactor();
      snprintf((char *)local_138,0x106,"%.*f",local_140 / dVar11,sVar7 & 0xffffffff);
      goto LAB_0010b656;
    }
    if (uVar2 == 0x75) {
      __format = "%u";
    }
    else {
      if (uVar2 != 0x78) goto LAB_0010b5d2;
      __format = "%x";
    }
  }
  snprintf((char *)local_138,0x106,__format,(ulong)value);
LAB_0010b656:
  __n = strlen((char *)local_138);
  uVar6 = (((ulong)(cVar5 != '\0') + 1) - (ulong)(cVar9 == '\0')) + __n;
  uVar4 = fmt->width;
  if (fmt->width <= uVar6) {
    uVar4 = uVar6;
  }
  uVar3 = bufLen - 1;
  if ((uVar3 < uVar4) && (error("Formatted numeric value too long\n"), uVar4 = uVar3, uVar3 < uVar6)
     ) {
    __n = (__n + uVar3) - uVar6;
    uVar6 = uVar3;
  }
  if ((((__n <= uVar6) && (__n_00 = uVar4 - uVar6, uVar6 <= uVar4)) && (uVar6 < bufLen)) &&
     (uVar4 < bufLen)) {
    if (fmt->alignLeft == true) {
      if (cVar9 != '\0') {
        *buf = cVar9;
      }
      uVar6 = (ulong)(cVar9 != '\0');
      if (cVar5 != '\0') {
        buf[uVar6] = cVar5;
        uVar6 = uVar6 + 1;
      }
      memcpy(buf + uVar6,local_138,__n);
      uVar6 = uVar6 + __n;
      if (uVar6 < uVar4) {
        memset(buf + uVar6,0x20,uVar4 - uVar6);
      }
    }
    else {
      if (fmt->padZero == false) {
        if (uVar4 == uVar6) {
          sVar8 = 0;
        }
        else {
          memset(buf,0x20,__n_00);
          sVar8 = __n_00;
        }
        if (cVar9 != '\0') {
          buf[sVar8] = cVar9;
          sVar8 = sVar8 + 1;
        }
        if (cVar5 != '\0') {
          buf[sVar8] = cVar5;
          sVar8 = sVar8 + 1;
        }
      }
      else {
        if (cVar9 != '\0') {
          *buf = cVar9;
        }
        sVar8 = (size_t)(cVar9 != '\0');
        if (cVar5 != '\0') {
          buf[sVar8] = cVar5;
          sVar8 = sVar8 + 1;
        }
        if (uVar4 != uVar6) {
          memset(buf + sVar8,0x30,__n_00);
          sVar8 = (sVar8 + uVar4) - uVar6;
        }
      }
      memcpy(buf + sVar8,local_138,__n);
    }
    buf[uVar4] = '\0';
    return;
  }
  __assert_fail("numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x101,"void fmt_PrintNumber(char *, size_t, const struct FormatSpec *, uint32_t)");
}

Assistant:

void fmt_PrintNumber(char *buf, size_t bufLen, struct FormatSpec const *fmt, uint32_t value)
{
	if (fmt->type != 'X' && fmt->type != 'x' && fmt->type != 'b' && fmt->type != 'o'
	    && fmt->prefix)
		error("Formatting type '%c' with prefix flag '#'\n", fmt->type);
	if (fmt->type != 'f' && fmt->hasFrac)
		error("Formatting type '%c' with fractional width\n", fmt->type);
	if (fmt->type == 's')
		error("Formatting number as type 's'\n");

	char sign = fmt->sign; // 0 or ' ' or '+'

	if (fmt->type == 'd' || fmt->type == 'f') {
		int32_t v = value;

		if (v < 0 && v != INT32_MIN) {
			sign = '-';
			value = -v;
		}
	}

	char prefix = !fmt->prefix ? 0
		: fmt->type == 'X' ? '$'
		: fmt->type == 'x' ? '$'
		: fmt->type == 'b' ? '%'
		: fmt->type == 'o' ? '&'
		: 0;

	char valueBuf[262]; // Max 5 digits + decimal + 255 fraction digits + terminator

	if (fmt->type == 'b') {
		// Special case for binary
		char *ptr = valueBuf;

		do {
			*ptr++ = (value & 1) + '0';
			value >>= 1;
		} while (value);

		*ptr = '\0';

		// Reverse the digits
		size_t valueLen = ptr - valueBuf;

		for (size_t i = 0, j = valueLen - 1; i < j; i++, j--) {
			char c = valueBuf[i];

			valueBuf[i] = valueBuf[j];
			valueBuf[j] = c;
		}
	} else if (fmt->type == 'f') {
		// Special case for fixed-point

		// Default fractional width (C's is 6 for "%f"; here 5 is enough for Q16.16)
		size_t fracWidth = fmt->hasFrac ? fmt->fracWidth : 5;

		if (fracWidth > 255) {
			error("Fractional width %zu too long, limiting to 255\n",
			      fracWidth);
			fracWidth = 255;
		}

		snprintf(valueBuf, sizeof(valueBuf), "%.*f", (int)fracWidth,
			 value / fix_PrecisionFactor());
	} else {
		char const *spec = fmt->type == 'd' ? "%" PRId32
				 : fmt->type == 'u' ? "%" PRIu32
				 : fmt->type == 'X' ? "%" PRIX32
				 : fmt->type == 'x' ? "%" PRIx32
				 : fmt->type == 'o' ? "%" PRIo32
				 : "%" PRId32;

		snprintf(valueBuf, sizeof(valueBuf), spec, value);
	}

	size_t len = strlen(valueBuf);
	size_t numLen = (sign != 0) + (prefix != 0) + len;
	size_t totalLen = fmt->width > numLen ? fmt->width : numLen;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted numeric value too long\n");
		totalLen = bufLen - 1;
		if (numLen > totalLen) {
			len -= numLen - totalLen;
			numLen = totalLen;
		}
	}
	assert(numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen);

	size_t padLen = totalLen - numLen;
	size_t pos = 0;

	if (fmt->alignLeft) {
		if (sign)
			buf[pos++] = sign;
		if (prefix)
			buf[pos++] = prefix;
		memcpy(buf + pos, valueBuf, len);
		for (size_t i = pos + len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		if (fmt->padZero) {
			// sign, then prefix, then zero padding
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = '0';
		} else {
			// space padding, then sign, then prefix
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = ' ';
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
		}
		memcpy(buf + pos, valueBuf, len);
	}

	buf[totalLen] = '\0';
}